

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetSourcesCommand.cxx
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
anon_unknown.dwarf_1617fc0::TargetSourcesImpl::ConvertToAbsoluteContent
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,TargetSourcesImpl *this,cmTarget *tgt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *content,IsInterface isInterfaceContent,CheckCMP0076 checkCmp0076)

{
  pointer pbVar1;
  size_t __n;
  TargetSourcesImpl *pTVar2;
  CheckCMP0076 CVar3;
  bool bVar4;
  PolicyStatus PVar5;
  int iVar6;
  size_type sVar7;
  string *psVar8;
  cmMakefile *pcVar9;
  string *psVar10;
  ostream *poVar11;
  PolicyID id;
  long lVar12;
  pointer in_name;
  char *pcVar13;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  bool bVar14;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string absoluteSrc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  absoluteContent;
  ostringstream e;
  string local_260;
  TargetSourcesImpl *local_230;
  CheckCMP0076 local_224;
  cmTarget *local_220;
  value_type local_218;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8;
  string local_1c8;
  undefined1 local_1a8 [16];
  undefined8 local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_190;
  size_type local_188;
  pointer local_180;
  ios_base local_138 [264];
  
  local_220 = tgt;
  if ((checkCmp0076 == Yes) &&
     (PVar5 = cmMakefile::GetPolicyStatus
                        ((this->super_cmTargetPropCommandBase).Makefile,CMP0076,false), PVar5 == OLD
     )) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(__return_storage_ptr__,content);
    return __return_storage_ptr__;
  }
  local_1e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_230 = this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&local_1e8,
            (long)(content->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(content->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 5);
  in_name = (content->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (content->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (in_name == pbVar1) {
LAB_003d07d7:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(__return_storage_ptr__,content);
    goto LAB_003d0995;
  }
  bVar14 = false;
  local_224 = checkCmp0076;
  local_1f8 = content;
  local_1f0 = __return_storage_ptr__;
  do {
    local_218._M_string_length = 0;
    local_218.field_2._M_local_buf[0] = '\0';
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    bVar4 = cmsys::SystemTools::FileIsFullPath(in_name);
    if ((bVar4) || (sVar7 = cmGeneratorExpression::Find(in_name), sVar7 == 0)) {
LAB_003d0764:
      std::__cxx11::string::_M_assign((string *)&local_218);
    }
    else {
      if (isInterfaceContent == No) {
        psVar8 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_
                           ((local_230->super_cmTargetPropCommandBase).Makefile);
        pcVar9 = cmTarget::GetMakefile(local_220);
        psVar10 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(pcVar9);
        __n = psVar8->_M_string_length;
        if ((__n == psVar10->_M_string_length) &&
           ((__n == 0 ||
            (iVar6 = bcmp((psVar8->_M_dataplus)._M_p,(psVar10->_M_dataplus)._M_p,__n), iVar6 == 0)))
           ) goto LAB_003d0764;
      }
      psVar8 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_
                         ((local_230->super_cmTargetPropCommandBase).Makefile);
      local_1a8._8_8_ = (psVar8->_M_dataplus)._M_p;
      local_1a8._0_8_ = psVar8->_M_string_length;
      local_260._M_dataplus._M_p = &DAT_00000001;
      local_260._M_string_length = (size_type)&local_260.field_2;
      local_260.field_2._M_local_buf[0] = '/';
      local_198 = 1;
      local_180 = (in_name->_M_dataplus)._M_p;
      local_188 = in_name->_M_string_length;
      views._M_len = 3;
      views._M_array = (iterator)local_1a8;
      local_190 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_260._M_string_length;
      cmCatViews_abi_cxx11_(&local_1c8,views);
      std::__cxx11::string::operator=((string *)&local_218,(string *)&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      bVar14 = true;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_1e8,&local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,
                      CONCAT71(local_218.field_2._M_allocated_capacity._1_7_,
                               local_218.field_2._M_local_buf[0]) + 1);
    }
    __return_storage_ptr__ = local_1f0;
    __x = local_1f8;
    CVar3 = local_224;
    in_name = in_name + 1;
  } while (in_name != pbVar1);
  content = local_1f8;
  if (!bVar14) goto LAB_003d07d7;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  pTVar2 = local_230;
  if (CVar3 != Yes) {
switchD_003d0824_caseD_2:
    bVar4 = true;
    bVar14 = false;
    goto LAB_003d08ab;
  }
  PVar5 = cmMakefile::GetPolicyStatus
                    ((local_230->super_cmTargetPropCommandBase).Makefile,CMP0076,false);
  bVar14 = true;
  switch(PVar5) {
  case OLD:
    bVar14 = false;
    break;
  case WARN:
    cmPolicies::GetPolicyWarning_abi_cxx11_(&local_260,(cmPolicies *)0x4c,id);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,local_260._M_dataplus._M_p,local_260._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
    goto LAB_003d088c;
  case NEW:
    goto switchD_003d0824_caseD_2;
  case REQUIRED_IF_USED:
  case REQUIRED_ALWAYS:
    pcVar9 = (pTVar2->super_cmTargetPropCommandBase).Makefile;
    cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_260,(cmPolicies *)0x4c,id);
    cmMakefile::IssueMessage(pcVar9,FATAL_ERROR,&local_260);
LAB_003d088c:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,
                      CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                               local_260.field_2._M_local_buf[0]) + 1);
    }
  }
  bVar4 = false;
LAB_003d08ab:
  if (bVar14) {
    pcVar13 = "A private source from a directory other than that of target \"";
    if (isInterfaceContent == Yes) {
      pcVar13 = "An interface source of target \"";
    }
    lVar12 = 0x3d;
    if (isInterfaceContent == Yes) {
      lVar12 = 0x1f;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar13,lVar12);
    psVar8 = cmTarget::GetName_abi_cxx11_(local_220);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(psVar8->_M_dataplus)._M_p,psVar8->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\" has a relative path.",0x16);
    pcVar9 = (pTVar2->super_cmTargetPropCommandBase).Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar9,AUTHOR_WARNING,&local_260);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,
                      CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                               local_260.field_2._M_local_buf[0]) + 1);
    }
  }
  if (bVar4) {
    __x = &local_1e8;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__,__x);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
LAB_003d0995:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1e8);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> TargetSourcesImpl::ConvertToAbsoluteContent(
  cmTarget* tgt, const std::vector<std::string>& content,
  IsInterface isInterfaceContent, CheckCMP0076 checkCmp0076)
{
  // Skip conversion in case old behavior has been explicitly requested
  if (checkCmp0076 == CheckCMP0076::Yes &&
      this->Makefile->GetPolicyStatus(cmPolicies::CMP0076) ==
        cmPolicies::OLD) {
    return content;
  }

  bool changedPath = false;
  std::vector<std::string> absoluteContent;
  absoluteContent.reserve(content.size());
  for (std::string const& src : content) {
    std::string absoluteSrc;
    if (cmSystemTools::FileIsFullPath(src) ||
        cmGeneratorExpression::Find(src) == 0 ||
        (isInterfaceContent == IsInterface::No &&
         (this->Makefile->GetCurrentSourceDirectory() ==
          tgt->GetMakefile()->GetCurrentSourceDirectory()))) {
      absoluteSrc = src;
    } else {
      changedPath = true;
      absoluteSrc =
        cmStrCat(this->Makefile->GetCurrentSourceDirectory(), '/', src);
    }
    absoluteContent.push_back(absoluteSrc);
  }

  if (!changedPath) {
    return content;
  }

  bool issueMessage = true;
  bool useAbsoluteContent = false;
  std::ostringstream e;
  if (checkCmp0076 == CheckCMP0076::Yes) {
    switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0076)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0076) << "\n";
        break;
      case cmPolicies::OLD:
        issueMessage = false;
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0076));
        break;
      case cmPolicies::NEW: {
        issueMessage = false;
        useAbsoluteContent = true;
        break;
      }
    }
  } else {
    issueMessage = false;
    useAbsoluteContent = true;
  }

  if (issueMessage) {
    if (isInterfaceContent == IsInterface::Yes) {
      e << "An interface source of target \"" << tgt->GetName()
        << "\" has a relative path.";
    } else {
      e << "A private source from a directory other than that of target \""
        << tgt->GetName() << "\" has a relative path.";
    }
    this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, e.str());
  }

  return useAbsoluteContent ? absoluteContent : content;
}